

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall Buffer_change_event_remove_Test::TestBody(Buffer_change_event_remove_Test *this)

{
  AssertHelperData *pAVar1;
  AssertHelperData *pAVar2;
  char *pcVar3;
  initializer_list<bfy_changed_cb_info> __l;
  AssertionResult gtest_ar_1;
  size_t i;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  array<char,_1024UL> array;
  allocator_type local_5f9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  long local_5e8;
  AssertHelperData *local_5e0;
  bfy_changed_cb_info local_5d8;
  internal local_5c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  undefined1 local_5b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_508;
  BufferWithReadonlyStrings local_4f0;
  undefined1 local_430 [1024];
  
  memset(local_430,0,0x400);
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_4f0);
  local_5d8.orig_size = CONCAT44(local_5d8.orig_size._4_4_,1);
  local_5f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bfy_buffer_peek(&local_4f0.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)local_5b0,"1","buffer_count_pages(&local.buf)",(int *)&local_5d8,
             (unsigned_long *)&local_5f8);
  if (local_5b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5f8);
    if (local_5a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_5a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5dc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5d8,(Message *)&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5d8);
    if (local_5f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5f8._M_head_impl + 8))();
    }
  }
  if (local_5a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5a8,local_5a8);
  }
  local_5e0 = (AssertHelperData *)0x1;
  pAVar2 = (AssertHelperData *)bfy_buffer_get_content_len(&local_4f0.buf);
  if (local_5e0 < pAVar2) {
    do {
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings
                ((BufferWithReadonlyStrings *)local_5b0);
      pAVar1 = local_5e0;
      bfy_buffer_set_changed_cb
                ((bfy_buffer *)local_5b0,
                 (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
                 {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
                 &local_508);
      local_5d8.orig_size = bfy_buffer_remove((bfy_buffer *)local_5b0,(size_t)local_5e0,local_430);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_5f8,"i","bfy_buffer_remove(&mabel.buf, i, std::data(array))",
                 (unsigned_long *)&local_5e0,&local_5d8.orig_size);
      if (local_5f8._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_5d8);
        pcVar3 = "";
        if (local_5f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_5f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_5c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                   ,0x5e7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_5c0,(Message *)&local_5d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5c0);
        if ((long *)local_5d8.orig_size != (long *)0x0) {
          (**(code **)(*(long *)local_5d8.orig_size + 8))();
        }
      }
      if (local_5f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_5f0,local_5f0);
      }
      local_5d8.n_added = 0;
      local_5d8.n_deleted = (size_t)pAVar1;
      __l._M_len = 1;
      __l._M_array = &local_5d8;
      local_5d8.orig_size = (size_t)pAVar2;
      std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
                ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&local_5f8,__l
                 ,&local_5f9);
      testing::internal::
      CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
                (local_5c0,"changes_t{expected}","mabel.changes",
                 (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&local_5f8,
                 &local_508);
      if (local_5f8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_5f8._M_head_impl,local_5e8 - (long)local_5f8._M_head_impl);
      }
      if (local_5c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_5f8);
        pcVar3 = "";
        if (local_5b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_5b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_5d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                   ,0x5e8,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_5d8,(Message *)&local_5f8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5d8);
        if (local_5f8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_5f8._M_head_impl + 8))();
        }
      }
      if (local_5b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_5b8,local_5b8);
      }
      anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
                ((BufferWithReadonlyStrings *)local_5b0);
      local_5e0 = (AssertHelperData *)((long)&local_5e0->type + 1);
    } while (local_5e0 < pAVar2);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_4f0);
  return;
}

Assistant:

TEST(Buffer, change_event_remove) {
    auto array = std::array<char, 1024> {};
    BufferWithReadonlyStrings const local;
    // confirm this test exercises removing <1, ==1, and >1 pages
    EXPECT_LT(1, buffer_count_pages(&local.buf));

    for (size_t i=1, n=bfy_buffer_get_content_len(&local.buf); i < n; ++i) {
        BufferWithReadonlyStrings mabel;
        auto const expected = bfy_changed_cb_info {
            .orig_size = n,
            .n_added = 0,
            .n_deleted = i
        };

        mabel.start_listening_to_changes();
        EXPECT_EQ(i, bfy_buffer_remove(&mabel.buf, i, std::data(array)));
        EXPECT_EQ(changes_t{expected}, mabel.changes);
    }
}